

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

uchar * GetMatch(uchar *scan,uchar *match,uchar *end,uchar *safe_end)

{
  bool bVar1;
  uchar *safe_end_local;
  uchar *end_local;
  uchar *match_local;
  uchar *scan_local;
  
  match_local = match;
  scan_local = scan;
  while( true ) {
    bVar1 = false;
    if (scan_local < safe_end) {
      bVar1 = *(long *)scan_local == *(long *)match_local;
    }
    if (!bVar1) break;
    scan_local = scan_local + 8;
    match_local = match_local + 8;
  }
  while( true ) {
    bVar1 = false;
    if (scan_local != end) {
      bVar1 = *scan_local == *match_local;
    }
    if (!bVar1) break;
    scan_local = scan_local + 1;
    match_local = match_local + 1;
  }
  return scan_local;
}

Assistant:

static const unsigned char* GetMatch(const unsigned char* scan,
                                     const unsigned char* match,
                                     const unsigned char* end,
                                     const unsigned char* safe_end) {

  if (sizeof(size_t) == 8) {
    /* 8 checks at once per array bounds check (size_t is 64-bit). */
    while (scan < safe_end && *((size_t*)scan) == *((size_t*)match)) {
      scan += 8;
      match += 8;
    }
  } else if (sizeof(unsigned int) == 4) {
    /* 4 checks at once per array bounds check (unsigned int is 32-bit). */
    while (scan < safe_end
        && *((unsigned int*)scan) == *((unsigned int*)match)) {
      scan += 4;
      match += 4;
    }
  } else {
    /* do 8 checks at once per array bounds check. */
    while (scan < safe_end && *scan == *match && *++scan == *++match
          && *++scan == *++match && *++scan == *++match
          && *++scan == *++match && *++scan == *++match
          && *++scan == *++match && *++scan == *++match) {
      scan++; match++;
    }
  }

  /* The remaining few bytes. */
  while (scan != end && *scan == *match) {
    scan++; match++;
  }

  return scan;
}